

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool MeCab::escape_csv_element(string *w)

{
  long lVar1;
  ulong uVar2;
  string tmp;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  lVar1 = std::__cxx11::string::find((char)w,0x2c);
  if ((lVar1 == -1) && (lVar1 = std::__cxx11::string::find((char)w,0x22), lVar1 == -1)) {
    return true;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"\"","");
  if (w->_M_string_length != 0) {
    uVar2 = 0;
    do {
      if ((w->_M_dataplus)._M_p[uVar2] == '\"') {
        std::__cxx11::string::push_back((char)local_40);
      }
      std::__cxx11::string::push_back((char)local_40);
      uVar2 = uVar2 + 1;
    } while (uVar2 < w->_M_string_length);
  }
  std::__cxx11::string::push_back((char)local_40);
  std::__cxx11::string::_M_assign((string *)w);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return true;
}

Assistant:

bool escape_csv_element(std::string *w) {
  if (w->find(',') != std::string::npos ||
      w->find('"') != std::string::npos) {
    std::string tmp = "\"";
    for (size_t j = 0; j < w->size(); j++) {
      if ((*w)[j] == '"') tmp += '"';
      tmp += (*w)[j];
    }
    tmp += '"';
    *w = tmp;
  }
  return true;
}